

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O0

Status __thiscall osqp::OsqpSolver::UpdateVerbose(OsqpSolver *this,bool verbose_new)

{
  bool bVar1;
  c_int cVar2;
  byte in_DL;
  undefined7 in_register_00000031;
  unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *this_00;
  string_view message;
  string_view message_00;
  OSQPWorkspace *work;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  byte local_19;
  unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *puStack_18;
  bool verbose_new_local;
  OsqpSolver *this_local;
  
  this_00 = (unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)
            CONCAT71(in_register_00000031,verbose_new);
  local_19 = in_DL & 1;
  work = (OSQPWorkspace *)this;
  puStack_18 = this_00;
  this_local = this;
  bVar1 = IsInitialized((OsqpSolver *)this_00);
  if (bVar1) {
    std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::get(this_00);
    cVar2 = osqp_update_verbose(work,0x1bb361);
    if (cVar2 == 0) {
      absl::OkStatus();
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_40,"osqp_update_verbose unexpectedly failed.");
      message_00._M_str = (char *)local_40._M_len;
      message_00._M_len = (size_t)work;
      absl::UnknownError(message_00);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,"OsqpSolver is not initialized.");
    message._M_str = (char *)local_30._M_len;
    message._M_len = (size_t)work;
    absl::FailedPreconditionError(message);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::UpdateVerbose(const bool verbose_new) {
  if (!IsInitialized()) {
    return absl::FailedPreconditionError("OsqpSolver is not initialized.");
  }
  if (osqp_update_verbose(workspace_.get(), verbose_new) != 0) {
    return absl::UnknownError("osqp_update_verbose unexpectedly failed.");
  }
  return absl::OkStatus();
}